

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O2

void get_msurf_descriptor_haar_unroll_4_3_True(integral_image *iimage,interest_point *ipoint)

{
  long lVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int i;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  uint uVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  float *pfVar34;
  long lVar35;
  int iVar36;
  float *pfVar37;
  float *pfVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar51;
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar64;
  float fVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  float fVar72;
  undefined1 auVar73 [12];
  undefined1 in_ZMM8 [64];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar76;
  undefined1 auVar77 [64];
  
  auVar47._8_4_ = 0x3effffff;
  auVar47._0_8_ = 0x3effffff3effffff;
  auVar47._12_4_ = 0x3effffff;
  auVar46._8_4_ = 0x80000000;
  auVar46._0_8_ = 0x8000000080000000;
  auVar46._12_4_ = 0x80000000;
  fVar52 = ipoint->scale;
  auVar77 = ZEXT464((uint)fVar52);
  auVar43 = ZEXT816(0x3fe0000000000000);
  auVar71 = ZEXT1664(auVar43);
  auVar48 = ZEXT416((uint)fVar52);
  auVar39 = vpternlogd_avx512vl(auVar47,auVar48,auVar46,0xf8);
  auVar39 = ZEXT416((uint)(fVar52 + auVar39._0_4_));
  auVar39 = vroundss_avx(auVar39,auVar39,0xb);
  fVar51 = -0.08 / (fVar52 * fVar52);
  iVar24 = (int)auVar39._0_4_;
  auVar40._0_4_ = (int)auVar39._0_4_;
  auVar40._4_4_ = (int)auVar39._4_4_;
  auVar40._8_4_ = (int)auVar39._8_4_;
  auVar40._12_4_ = (int)auVar39._12_4_;
  auVar39 = vcvtdq2ps_avx(auVar40);
  auVar40 = vpternlogd_avx512vl(auVar47,ZEXT416((uint)ipoint->x),auVar46,0xf8);
  auVar40 = ZEXT416((uint)(ipoint->x + auVar40._0_4_));
  auVar40 = vroundss_avx(auVar40,auVar40,0xb);
  auVar41._0_8_ = (double)auVar40._0_4_;
  auVar41._8_8_ = auVar40._8_8_;
  auVar45._0_8_ = (double)fVar52;
  auVar45._8_8_ = 0;
  auVar40 = vfmadd231sd_fma(auVar41,auVar45,auVar43);
  auVar44._0_4_ = (float)auVar40._0_8_;
  auVar44._4_12_ = auVar40._4_12_;
  auVar40 = vpternlogd_avx512vl(auVar47,ZEXT416((uint)ipoint->y),auVar46,0xf8);
  fVar3 = auVar44._0_4_ - auVar39._0_4_;
  auVar40 = ZEXT416((uint)(ipoint->y + auVar40._0_4_));
  auVar40 = vroundss_avx(auVar40,auVar40,0xb);
  auVar42._0_8_ = (double)auVar40._0_4_;
  auVar42._8_8_ = auVar40._8_8_;
  auVar40 = vfmadd231sd_fma(auVar42,auVar45,auVar43);
  auVar43._0_4_ = (float)auVar40._0_8_;
  auVar43._4_12_ = auVar40._4_12_;
  fVar76 = auVar43._0_4_ - auVar39._0_4_;
  auVar41 = ZEXT416((uint)fVar52);
  auVar39 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar41,auVar44);
  auVar40 = vpternlogd_avx512vl(auVar47,auVar39,auVar46,0xf8);
  auVar39 = ZEXT416((uint)(auVar39._0_4_ + auVar40._0_4_));
  auVar39 = vroundss_avx(auVar39,auVar39,0xb);
  if (iVar24 < (int)auVar39._0_4_) {
    auVar49._8_4_ = 0x3effffff;
    auVar49._0_8_ = 0x3effffff3effffff;
    auVar49._12_4_ = 0x3effffff;
    auVar50._8_4_ = 0x80000000;
    auVar50._0_8_ = 0x8000000080000000;
    auVar50._12_4_ = 0x80000000;
    auVar39 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar41,auVar43);
    auVar40 = vpternlogd_avx512vl(auVar50,auVar39,auVar49,0xea);
    auVar39 = ZEXT416((uint)(auVar39._0_4_ + auVar40._0_4_));
    auVar39 = vroundss_avx(auVar39,auVar39,0xb);
    if (iVar24 < (int)auVar39._0_4_) {
      auVar39 = vfmadd231ss_fma(auVar44,auVar41,ZEXT416(0x41300000));
      auVar68._8_4_ = 0x80000000;
      auVar68._0_8_ = 0x8000000080000000;
      auVar68._12_4_ = 0x80000000;
      auVar40 = vpternlogd_avx512vl(auVar68,auVar39,auVar49,0xea);
      auVar39 = ZEXT416((uint)(auVar39._0_4_ + auVar40._0_4_));
      auVar39 = vroundss_avx(auVar39,auVar39,0xb);
      if ((int)auVar39._0_4_ + iVar24 <= iimage->width) {
        auVar39 = vfmadd231ss_fma(auVar43,auVar41,ZEXT416(0x41300000));
        auVar13._8_4_ = 0x80000000;
        auVar13._0_8_ = 0x8000000080000000;
        auVar13._12_4_ = 0x80000000;
        auVar40 = vpternlogd_avx512vl(auVar49,auVar39,auVar13,0xf8);
        auVar39 = ZEXT416((uint)(auVar39._0_4_ + auVar40._0_4_));
        auVar39 = vroundss_avx(auVar39,auVar39,0xb);
        if ((int)auVar39._0_4_ + iVar24 <= iimage->height) {
          fVar3 = fVar3 + 0.5;
          fVar76 = fVar76 + 0.5;
          lVar25 = 0xc0;
          for (uVar29 = 0xfffffff4; (int)uVar29 < 0xc; uVar29 = uVar29 + 4) {
            auVar39._0_4_ = (float)(int)uVar29;
            auVar73 = in_ZMM8._4_12_;
            auVar39._4_12_ = auVar73;
            auVar40 = auVar77._0_16_;
            auVar39 = vfmadd213ss_fma(auVar39,auVar40,ZEXT416((uint)fVar76));
            iVar18 = (int)auVar39._0_4_;
            auVar55._0_4_ = (float)(int)(uVar29 | 1);
            auVar55._4_12_ = auVar73;
            auVar39 = vfmadd213ss_fma(auVar55,auVar40,ZEXT416((uint)fVar76));
            iVar17 = (int)auVar39._0_4_;
            auVar56._0_4_ = (float)(int)(uVar29 | 2);
            auVar56._4_12_ = auVar73;
            auVar39 = vfmadd213ss_fma(auVar56,auVar40,ZEXT416((uint)fVar76));
            iVar16 = (int)auVar39._0_4_;
            auVar57._0_4_ = (float)(int)(uVar29 | 3);
            auVar57._4_12_ = auVar73;
            auVar39 = vfmadd213ss_fma(auVar57,auVar40,ZEXT416((uint)fVar76));
            iVar15 = (int)auVar39._0_4_;
            lVar26 = lVar25;
            for (iVar21 = -0xc; iVar21 < 0xc; iVar21 = iVar21 + 3) {
              auVar58._0_4_ = (float)iVar21;
              auVar58._4_12_ = in_ZMM8._4_12_;
              auVar39 = vfmadd213ss_fma(auVar58,auVar48,ZEXT416((uint)fVar3));
              iVar36 = (int)auVar39._0_4_;
              auVar59._0_4_ = (float)(iVar21 + 1);
              auVar59._4_12_ = auVar71._4_12_;
              auVar39 = vfmadd213ss_fma(auVar59,auVar48,ZEXT416((uint)fVar3));
              iVar19 = (int)auVar39._0_4_;
              auVar60._0_4_ = (float)(iVar21 + 2);
              auVar60._4_12_ = auVar71._4_12_;
              auVar39 = vfmadd213ss_fma(auVar60,auVar48,ZEXT416((uint)fVar3));
              iVar20 = (int)auVar39._0_4_;
              haarXY_unconditional
                        (iimage,iVar18,iVar36,iVar24,(float *)((long)haarResponseX + lVar26 + -0xc0)
                         ,(float *)((long)haarResponseY + lVar26 + -0xc0));
              haarXY_unconditional
                        (iimage,iVar17,iVar36,iVar24,(float *)((long)haarResponseX + lVar26 + -0x60)
                         ,(float *)((long)haarResponseY + lVar26 + -0x60));
              haarXY_unconditional
                        (iimage,iVar16,iVar36,iVar24,(float *)((long)haarResponseX + lVar26),
                         (float *)((long)haarResponseY + lVar26));
              haarXY_unconditional
                        (iimage,iVar15,iVar36,iVar24,(float *)((long)haarResponseX + lVar26 + 0x60),
                         (float *)((long)haarResponseY + lVar26 + 0x60));
              haarXY_unconditional
                        (iimage,iVar18,iVar19,iVar24,(float *)((long)haarResponseX + lVar26 + -0xbc)
                         ,(float *)((long)haarResponseY + lVar26 + -0xbc));
              haarXY_unconditional
                        (iimage,iVar17,iVar19,iVar24,(float *)((long)haarResponseX + lVar26 + -0x5c)
                         ,(float *)((long)haarResponseY + lVar26 + -0x5c));
              haarXY_unconditional
                        (iimage,iVar16,iVar19,iVar24,(float *)((long)haarResponseX + lVar26 + 4),
                         (float *)((long)haarResponseY + lVar26 + 4));
              haarXY_unconditional
                        (iimage,iVar15,iVar19,iVar24,(float *)((long)haarResponseX + lVar26 + 100),
                         (float *)((long)haarResponseY + lVar26 + 100));
              haarXY_unconditional
                        (iimage,iVar18,iVar20,iVar24,(float *)((long)haarResponseX + lVar26 + -0xb8)
                         ,(float *)((long)haarResponseY + lVar26 + -0xb8));
              haarXY_unconditional
                        (iimage,iVar17,iVar20,iVar24,(float *)((long)haarResponseX + lVar26 + -0x58)
                         ,(float *)((long)haarResponseY + lVar26 + -0x58));
              haarXY_unconditional
                        (iimage,iVar16,iVar20,iVar24,(float *)((long)haarResponseX + lVar26 + 8),
                         (float *)((long)haarResponseY + lVar26 + 8));
              haarXY_unconditional
                        (iimage,iVar15,iVar20,iVar24,(float *)((long)haarResponseX + lVar26 + 0x68),
                         (float *)((long)haarResponseY + lVar26 + 0x68));
              lVar26 = lVar26 + 0xc;
            }
            auVar77 = ZEXT1664(auVar48);
            lVar25 = lVar25 + 0x180;
          }
          goto LAB_0018f118;
        }
      }
    }
  }
  lVar25 = 0xc0;
  for (uVar29 = 0xfffffff4; (int)uVar29 < 0xc; uVar29 = uVar29 + 4) {
    auVar53._0_4_ = (float)(int)uVar29;
    auVar73 = in_ZMM8._4_12_;
    auVar53._4_12_ = auVar73;
    auVar41 = auVar77._0_16_;
    auVar39 = vfmadd213ss_fma(auVar53,auVar41,ZEXT416((uint)fVar76));
    auVar62._0_4_ = (float)(int)(uVar29 | 1);
    auVar62._4_12_ = auVar73;
    fVar52 = auVar39._0_4_;
    auVar66._0_4_ = (float)(int)(uVar29 | 2);
    auVar66._4_12_ = auVar73;
    auVar69._0_4_ = (float)(int)(uVar29 | 3);
    auVar69._4_12_ = auVar73;
    auVar39 = vfmadd213ss_fma(auVar62,auVar41,ZEXT416((uint)fVar76));
    auVar40 = vfmadd213ss_fma(auVar66,auVar41,ZEXT416((uint)fVar76));
    auVar41 = vfmadd213ss_fma(auVar69,auVar41,ZEXT416((uint)fVar76));
    fVar61 = auVar39._0_4_;
    iVar15 = (int)((double)((ulong)(0.0 <= fVar52) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar52) * -0x4020000000000000) + (double)fVar52);
    fVar52 = auVar40._0_4_;
    iVar16 = (int)((double)((ulong)(0.0 <= fVar61) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar61) * -0x4020000000000000) + (double)fVar61);
    fVar61 = auVar41._0_4_;
    iVar17 = (int)((double)((ulong)(0.0 <= fVar52) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar52) * -0x4020000000000000) + (double)fVar52);
    iVar18 = (int)((double)((ulong)(0.0 <= fVar61) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar61) * -0x4020000000000000) + (double)fVar61);
    lVar26 = lVar25;
    for (iVar21 = -0xc; iVar21 < 0xc; iVar21 = iVar21 + 3) {
      auVar54._0_4_ = (float)iVar21;
      auVar73 = in_ZMM8._4_12_;
      auVar54._4_12_ = auVar73;
      auVar39 = vfmadd213ss_fma(auVar54,auVar48,ZEXT416((uint)fVar3));
      auVar63._0_4_ = (float)(iVar21 + 1);
      auVar63._4_12_ = auVar73;
      auVar40 = vfmadd213ss_fma(auVar63,auVar48,ZEXT416((uint)fVar3));
      auVar67._0_4_ = (float)(iVar21 + 2);
      auVar67._4_12_ = auVar73;
      auVar41 = vfmadd213ss_fma(auVar67,auVar48,ZEXT416((uint)fVar3));
      fVar52 = auVar39._0_4_;
      fVar61 = auVar40._0_4_;
      fVar64 = auVar41._0_4_;
      iVar36 = (int)((double)((ulong)(0.0 <= fVar52) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar52) * -0x4020000000000000) + (double)fVar52);
      iVar19 = (int)((double)((ulong)(0.0 <= fVar61) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar61) * -0x4020000000000000) + (double)fVar61);
      iVar20 = (int)((double)((ulong)(0.0 <= fVar64) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar64) * -0x4020000000000000) + (double)fVar64);
      haarXY_precheck_boundaries
                (iimage,iVar15,iVar36,iVar24,(float *)((long)haarResponseX + lVar26 + -0xc0),
                 (float *)((long)haarResponseY + lVar26 + -0xc0));
      haarXY_precheck_boundaries
                (iimage,iVar16,iVar36,iVar24,(float *)((long)haarResponseX + lVar26 + -0x60),
                 (float *)((long)haarResponseY + lVar26 + -0x60));
      haarXY_precheck_boundaries
                (iimage,iVar17,iVar36,iVar24,(float *)((long)haarResponseX + lVar26),
                 (float *)((long)haarResponseY + lVar26));
      haarXY_precheck_boundaries
                (iimage,iVar18,iVar36,iVar24,(float *)((long)haarResponseX + lVar26 + 0x60),
                 (float *)((long)haarResponseY + lVar26 + 0x60));
      haarXY_precheck_boundaries
                (iimage,iVar15,iVar19,iVar24,(float *)((long)haarResponseX + lVar26 + -0xbc),
                 (float *)((long)haarResponseY + lVar26 + -0xbc));
      haarXY_precheck_boundaries
                (iimage,iVar16,iVar19,iVar24,(float *)((long)haarResponseX + lVar26 + -0x5c),
                 (float *)((long)haarResponseY + lVar26 + -0x5c));
      haarXY_precheck_boundaries
                (iimage,iVar17,iVar19,iVar24,(float *)((long)haarResponseX + lVar26 + 4),
                 (float *)((long)haarResponseY + lVar26 + 4));
      haarXY_precheck_boundaries
                (iimage,iVar18,iVar19,iVar24,(float *)((long)haarResponseX + lVar26 + 100),
                 (float *)((long)haarResponseY + lVar26 + 100));
      haarXY_precheck_boundaries
                (iimage,iVar15,iVar20,iVar24,(float *)((long)haarResponseX + lVar26 + -0xb8),
                 (float *)((long)haarResponseY + lVar26 + -0xb8));
      haarXY_precheck_boundaries
                (iimage,iVar16,iVar20,iVar24,(float *)((long)haarResponseX + lVar26 + -0x58),
                 (float *)((long)haarResponseY + lVar26 + -0x58));
      haarXY_precheck_boundaries
                (iimage,iVar17,iVar20,iVar24,(float *)((long)haarResponseX + lVar26 + 8),
                 (float *)((long)haarResponseY + lVar26 + 8));
      haarXY_precheck_boundaries
                (iimage,iVar18,iVar20,iVar24,(float *)((long)haarResponseX + lVar26 + 0x68),
                 (float *)((long)haarResponseY + lVar26 + 0x68));
      lVar26 = lVar26 + 0xc;
    }
    auVar77 = ZEXT1664(auVar48);
    lVar25 = lVar25 + 0x180;
  }
LAB_0018f118:
  fVar76 = auVar77._0_4_;
  auVar75._8_4_ = 0x3effffff;
  auVar75._0_8_ = 0x3effffff3effffff;
  auVar75._12_4_ = 0x3effffff;
  auVar74._8_4_ = 0x80000000;
  auVar74._0_8_ = 0x8000000080000000;
  auVar74._12_4_ = 0x80000000;
  auVar39 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)(fVar76 * 0.5)),auVar74,0xf8);
  auVar39 = ZEXT416((uint)(fVar76 * 0.5 + auVar39._0_4_));
  auVar39 = vroundss_avx(auVar39,auVar39,0xb);
  auVar40 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)(fVar76 * 1.5)),auVar74,0xf8);
  auVar40 = ZEXT416((uint)(fVar76 * 1.5 + auVar40._0_4_));
  auVar40 = vroundss_avx(auVar40,auVar40,0xb);
  auVar41 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)(fVar76 * 2.5)),auVar74,0xf8);
  auVar41 = ZEXT416((uint)(fVar76 * 2.5 + auVar41._0_4_));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  auVar42 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)(fVar76 * 3.5)),auVar74,0xf8);
  auVar42 = ZEXT416((uint)(fVar76 * 3.5 + auVar42._0_4_));
  auVar42 = vroundss_avx(auVar42,auVar42,0xb);
  auVar43 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)(fVar76 * 4.5)),auVar74,0xf8);
  auVar43 = ZEXT416((uint)(fVar76 * 4.5 + auVar43._0_4_));
  auVar43 = vroundss_avx(auVar43,auVar43,0xb);
  auVar44 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)(fVar76 * 5.5)),auVar74,0xf8);
  auVar44 = ZEXT416((uint)(fVar76 * 5.5 + auVar44._0_4_));
  auVar44 = vroundss_avx(auVar44,auVar44,0xb);
  auVar45 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)(fVar76 * 6.5)),auVar74,0xf8);
  auVar45 = ZEXT416((uint)(fVar76 * 6.5 + auVar45._0_4_));
  auVar45 = vroundss_avx(auVar45,auVar45,0xb);
  auVar46 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)(fVar76 * 7.5)),auVar74,0xf8);
  auVar46 = ZEXT416((uint)(auVar46._0_4_ + fVar76 * 7.5));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar47 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)(fVar76 * 8.5)),auVar74,0xf8);
  auVar47 = ZEXT416((uint)(fVar76 * 8.5 + auVar47._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  auVar48 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)(fVar76 * 9.5)),auVar74,0xf8);
  auVar48 = ZEXT416((uint)(fVar76 * 9.5 + auVar48._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar49 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)(fVar76 * 10.5)),auVar74,0xf8);
  auVar49 = ZEXT416((uint)(fVar76 * 10.5 + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar50 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)(fVar76 * 11.5)),auVar74,0xf8);
  fVar65 = auVar41._0_4_;
  fVar52 = fVar65 + auVar40._0_4_;
  fVar3 = fVar65 + auVar39._0_4_;
  auVar41 = ZEXT416((uint)(fVar76 * 11.5 + auVar50._0_4_));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  fVar76 = fVar65 - auVar39._0_4_;
  fVar61 = fVar65 - auVar40._0_4_;
  fVar64 = fVar65 - auVar42._0_4_;
  fVar4 = fVar65 - auVar43._0_4_;
  fVar5 = fVar65 - auVar44._0_4_;
  fVar65 = fVar65 - auVar45._0_4_;
  fVar72 = auVar46._0_4_;
  fVar6 = fVar72 - auVar42._0_4_;
  fVar7 = fVar72 - auVar43._0_4_;
  fVar8 = fVar72 - auVar44._0_4_;
  fVar9 = fVar72 - auVar45._0_4_;
  fVar10 = fVar72 - auVar47._0_4_;
  fVar11 = fVar72 - auVar48._0_4_;
  fVar12 = fVar72 - auVar49._0_4_;
  fVar72 = fVar72 - auVar41._0_4_;
  gauss_s1_c0[0] = expf(fVar52 * fVar52 * fVar51);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar51);
  gauss_s1_c0[2] = expf(fVar76 * fVar76 * fVar51);
  gauss_s1_c0[3] = expf(fVar61 * fVar61 * fVar51);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar64 * fVar64 * fVar51);
  gauss_s1_c0[6] = expf(fVar4 * fVar4 * fVar51);
  gauss_s1_c0[7] = expf(fVar5 * fVar5 * fVar51);
  gauss_s1_c0[8] = expf(fVar65 * fVar65 * fVar51);
  gauss_s1_c1[0] = expf(fVar6 * fVar6 * fVar51);
  gauss_s1_c1[1] = expf(fVar7 * fVar7 * fVar51);
  gauss_s1_c1[2] = expf(fVar8 * fVar8 * fVar51);
  gauss_s1_c1[3] = expf(fVar9 * fVar9 * fVar51);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar10 * fVar10 * fVar51);
  gauss_s1_c1[6] = expf(fVar11 * fVar11 * fVar51);
  gauss_s1_c1[7] = expf(fVar12 * fVar12 * fVar51);
  gauss_s1_c1[8] = expf(fVar72 * fVar72 * fVar51);
  auVar71 = ZEXT1264(ZEXT812(0));
  lVar25 = 0;
  auVar48._8_4_ = 0x7fffffff;
  auVar48._0_8_ = 0x7fffffff7fffffff;
  auVar48._12_4_ = 0x7fffffff;
  iVar24 = 0;
  lVar26 = 0;
  uVar23 = 0xfffffffffffffff8;
  while (uVar29 = (uint)uVar23, (int)uVar29 < 8) {
    pfVar37 = gauss_s1_c1;
    if (uVar29 != 7) {
      pfVar37 = gauss_s1_c0;
    }
    lVar35 = (long)iVar24;
    lVar26 = (long)(int)lVar26;
    iVar24 = iVar24 + 4;
    if (uVar29 == 0xfffffff8) {
      pfVar37 = gauss_s1_c1;
    }
    uVar27 = 0;
    uVar33 = 0xfffffffffffffff8;
    lVar28 = lVar25;
    while (lVar35 != iVar24) {
      pfVar38 = gauss_s1_c1;
      iVar21 = (int)uVar33;
      if (iVar21 != 7) {
        pfVar38 = gauss_s1_c0;
      }
      auVar77 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar33 = (ulong)((uint)(uVar33 >> 0x1c) & 8);
      if (iVar21 == -8) {
        pfVar38 = gauss_s1_c1;
      }
      lVar30 = (long)haarResponseX + lVar28;
      lVar31 = (long)haarResponseY + lVar28;
      for (uVar22 = uVar27; uVar22 < iVar21 * 0x18 + 0x198; uVar22 = uVar22 + 0x18) {
        lVar32 = 0;
        pfVar34 = (float *)((long)pfVar37 + (ulong)(((uint)(uVar23 >> 0x1f) & 1) << 5));
        while (lVar32 != 9) {
          fVar52 = *pfVar34;
          pfVar34 = pfVar34 + (ulong)(~uVar29 >> 0x1f) * 2 + -1;
          lVar1 = lVar32 * 4;
          lVar2 = lVar32 * 4;
          lVar32 = lVar32 + 1;
          auVar41 = ZEXT416((uint)(pfVar38[uVar33] * fVar52 * *(float *)(lVar30 + lVar2)));
          auVar39 = vandps_avx(auVar41,auVar48);
          auVar42 = ZEXT416((uint)(pfVar38[uVar33] * fVar52 * *(float *)(lVar31 + lVar1)));
          auVar40 = vandps_avx(auVar42,auVar48);
          auVar41 = vinsertps_avx(auVar42,auVar41,0x10);
          auVar40 = vmovlhps_avx(auVar41,auVar40);
          auVar39 = vinsertps_avx(auVar40,auVar39,0x30);
          auVar77 = ZEXT1664(CONCAT412(auVar77._12_4_ + auVar39._12_4_,
                                       CONCAT48(auVar77._8_4_ + auVar39._8_4_,
                                                CONCAT44(auVar77._4_4_ + auVar39._4_4_,
                                                         auVar77._0_4_ + auVar39._0_4_))));
        }
        uVar33 = uVar33 + (ulong)(-1 < iVar21) * 2 + -1;
        lVar30 = lVar30 + 0x60;
        lVar31 = lVar31 + 0x60;
      }
      uVar33 = (ulong)(iVar21 + 5);
      uVar27 = uVar27 + 0x78;
      lVar28 = lVar28 + 0x1e0;
      fVar52 = gauss_s2_arr[lVar35];
      auVar14._4_4_ = fVar52;
      auVar14._0_4_ = fVar52;
      auVar14._8_4_ = fVar52;
      auVar14._12_4_ = fVar52;
      auVar42 = vmulps_avx512vl(auVar77._0_16_,auVar14);
      lVar35 = lVar35 + 1;
      auVar70._0_4_ = auVar42._0_4_ * auVar42._0_4_;
      auVar70._4_4_ = auVar42._4_4_ * auVar42._4_4_;
      auVar70._8_4_ = auVar42._8_4_ * auVar42._8_4_;
      auVar70._12_4_ = auVar42._12_4_ * auVar42._12_4_;
      auVar40 = vshufpd_avx(auVar42,auVar42,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar26) = auVar42;
      lVar26 = lVar26 + 4;
      auVar39 = vmovshdup_avx(auVar70);
      auVar41 = vfmadd231ss_fma(auVar39,auVar42,auVar42);
      auVar39 = vshufps_avx(auVar42,auVar42,0xff);
      auVar40 = vfmadd213ss_fma(auVar40,auVar40,auVar41);
      auVar39 = vfmadd213ss_fma(auVar39,auVar39,auVar40);
      auVar71 = ZEXT464((uint)(auVar71._0_4_ + auVar39._0_4_));
    }
    lVar25 = lVar25 + 0x14;
    uVar23 = (ulong)(uVar29 + 5);
  }
  if (auVar71._0_4_ < 0.0) {
    fVar52 = sqrtf(auVar71._0_4_);
  }
  else {
    auVar39 = vsqrtss_avx(auVar71._0_16_,auVar71._0_16_);
    fVar52 = auVar39._0_4_;
  }
  for (lVar25 = 0; lVar25 != 0x40; lVar25 = lVar25 + 1) {
    ipoint->descriptor[lVar25] = (1.0 / fVar52) * ipoint->descriptor[lVar25];
  }
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_4_3_True(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=4, l_count+=4) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            float ipoint_y_sub_int_scale_add_l2_mul_scale = ipoint_y_sub_int_scale + l2 * scale;
            float ipoint_y_sub_int_scale_add_l3_mul_scale = ipoint_y_sub_int_scale + l3 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_l2_mul_scale + (ipoint_y_sub_int_scale_add_l2_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_l3_mul_scale + (ipoint_y_sub_int_scale_add_l3_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=3, k_count+=3) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=4, l_count+=4) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_05 + l2 * scale);
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_05 + l3 * scale);

            for (int k=-12, k_count=0; k<12; k+=3, k_count+=3) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}